

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O2

void roaring64_bitmap_and_inplace(roaring64_bitmap_t *r1,roaring64_bitmap_t *r2)

{
  container_t *c;
  ulong uVar1;
  uint8_t type;
  _Bool _Var2;
  int iVar3;
  ulong uVar4;
  container_t *pcVar5;
  uint8_t typecode2;
  byte local_171 [9];
  leaf_t leaf;
  ulong *local_160;
  roaring64_bitmap_t *local_158;
  art_iterator_t it1;
  art_iterator_t it2;
  
  if (r1 != r2) {
    art_init_iterator(&it1,&r1->art,true);
    art_init_iterator(&it2,&r2->art,true);
    local_158 = r2;
    while( true ) {
      if (it1.value == (art_val_t *)0x0) break;
      if (it2.value == (art_val_t *)0x0) {
LAB_00112f19:
        art_iterator_erase(&it1,&leaf);
        container_free(r1->containers[leaf >> 8],(uint8_t)leaf);
        uVar4 = leaf >> 8;
        r1->containers[uVar4] = (container_t *)0x0;
        if (uVar4 < r1->first_free) {
          r1->first_free = uVar4;
        }
      }
      else {
        iVar3 = art_compare_keys(it1.key,it2.key);
        if (iVar3 == 0) {
          uVar4 = *it2.value;
          local_160 = it1.value;
          c = r1->containers[*it1.value >> 8];
          pcVar5 = r2->containers[uVar4 >> 8];
          local_171[0] = (byte)*it1.value;
          if (local_171[0] != 4) {
            leaf = (leaf_t)get_writable_copy_if_shared(c,local_171);
            if ((uint8_t)uVar4 == '\x04') {
              uVar4 = (ulong)*(byte *)((long)pcVar5 + 8);
            }
            local_171[1] = 0;
            local_171[2] = 0;
            local_171[3] = 0;
            local_171[4] = 0;
            local_171[5] = 0;
            local_171[6] = 0;
            local_171[7] = 0;
            local_171[8] = 0;
            (*(code *)(&DAT_00130284 +
                      *(int *)(&DAT_00130284 +
                              (ulong)((((uint)uVar4 & 0xff) + (uint)local_171[0] * 4) - 5) * 4)))();
            return;
          }
          pcVar5 = container_and(c,'\x04',pcVar5,(uint8_t)uVar4,&typecode2);
          if (pcVar5 != c) {
            container_free(c,'\x04');
          }
          type = typecode2;
          uVar4 = (ulong)typecode2;
          _Var2 = container_nonzero_cardinality(pcVar5,typecode2);
          if (_Var2) {
            if (pcVar5 != c) {
              uVar1 = *local_160;
              r1->containers[uVar1 >> 8] = pcVar5;
              *local_160 = uVar1 & 0xffffffffffffff00 | uVar4;
            }
            art_iterator_next(&it1);
          }
          else {
            container_free(pcVar5,type);
            art_iterator_erase(&it1,(art_val_t *)0x0);
            uVar4 = *local_160 >> 8;
            r1->containers[uVar4] = (container_t *)0x0;
            if (uVar4 < r1->first_free) {
              r1->first_free = uVar4;
            }
          }
          art_iterator_next(&it2);
          r2 = local_158;
        }
        else {
          if (iVar3 < 0) goto LAB_00112f19;
          art_iterator_lower_bound(&it2,it1.key);
        }
      }
    }
  }
  return;
}

Assistant:

void roaring64_bitmap_and_inplace(roaring64_bitmap_t *r1,
                                  const roaring64_bitmap_t *r2) {
    if (r1 == r2) {
        return;
    }
    art_iterator_t it1 = art_init_iterator(&r1->art, /*first=*/true);
    art_iterator_t it2 = art_init_iterator((art_t *)&r2->art, /*first=*/true);

    while (it1.value != NULL) {
        // Cases:
        // 1. !it2_present -> erase it1
        // 2. it2_present
        //    a. it1 <  it2 -> erase it1
        //    b. it1 == it2 -> output it1 & it2, it1++, it2++
        //    c. it1 >  it2 -> it2++
        bool it2_present = it2.value != NULL;
        int compare_result = 0;
        if (it2_present) {
            compare_result = compare_high48(it1.key, it2.key);
            if (compare_result == 0) {
                // Case 2a: iterators at the same high key position.
                leaf_t *leaf1 = (leaf_t *)it1.value;
                leaf_t leaf2 = (leaf_t)*it2.value;

                // We do the computation "in place" only when c1 is not a
                // shared container. Rationale: using a shared container
                // safely with in place computation would require making a
                // copy and then doing the computation in place which is
                // likely less efficient than avoiding in place entirely and
                // always generating a new container.
                uint8_t typecode = get_typecode(*leaf1);
                container_t *container = get_container(r1, *leaf1);
                uint8_t typecode2;
                container_t *container2;
                if (typecode == SHARED_CONTAINER_TYPE) {
                    container2 = container_and(container, typecode,
                                               get_container(r2, leaf2),
                                               get_typecode(leaf2), &typecode2);
                } else {
                    container2 = container_iand(
                        container, typecode, get_container(r2, leaf2),
                        get_typecode(leaf2), &typecode2);
                }

                if (container2 != container) {
                    container_free(container, typecode);
                }
                if (!container_nonzero_cardinality(container2, typecode2)) {
                    container_free(container2, typecode2);
                    art_iterator_erase(&it1, NULL);
                    remove_container(r1, *leaf1);
                } else {
                    if (container2 != container) {
                        replace_container(r1, leaf1, container2, typecode2);
                    }
                    // Only advance the iterator if we didn't delete the
                    // leaf, as erasing advances by itself.
                    art_iterator_next(&it1);
                }
                art_iterator_next(&it2);
            }
        }

        if (!it2_present || compare_result < 0) {
            // Cases 1 and 3a: it1 is the only iterator or is before it2.
            leaf_t leaf;
            bool erased = art_iterator_erase(&it1, (art_val_t *)&leaf);
            assert(erased);
            container_free(get_container(r1, leaf), get_typecode(leaf));
            remove_container(r1, leaf);
        } else if (compare_result > 0) {
            // Case 2c: it1 is after it2.
            art_iterator_lower_bound(&it2, it1.key);
        }
    }
}